

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

Node * __thiscall Builder::AddTarget(Builder *this,string *name,string *err)

{
  StringPiece path;
  bool bVar1;
  Node *target;
  long *plVar2;
  Node *pNVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  path.str_ = (name->_M_dataplus)._M_p;
  path.len_ = name->_M_string_length;
  target = State::LookupNode(this->state_,path);
  if (target == (Node *)0x0) {
    std::operator+(&local_60,"unknown target: \'",name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_30 = *plVar4;
      lStack_28 = plVar2[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar4;
      local_40 = (long *)*plVar2;
    }
    local_38 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40,local_30 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    pNVar3 = (Node *)0x0;
  }
  else {
    bVar1 = AddTarget(this,target,err);
    pNVar3 = (Node *)0x0;
    if (bVar1) {
      pNVar3 = target;
    }
  }
  return pNVar3;
}

Assistant:

Node* Builder::AddTarget(const string& name, string* err) {
  Node* node = state_->LookupNode(name);
  if (!node) {
    *err = "unknown target: '" + name + "'";
    return NULL;
  }
  if (!AddTarget(node, err))
    return NULL;
  return node;
}